

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O0

void __thiscall xmrig::Hashrate::Hashrate(Hashrate *this,size_t threads)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  ulong in_RSI;
  ulong *in_RDI;
  size_t i;
  ulong local_18;
  
  *in_RDI = in_RSI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  in_RDI[2] = (ulong)pvVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RSI;
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  in_RDI[3] = (ulong)pvVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_RSI;
  uVar4 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  in_RDI[1] = (ulong)pvVar5;
  for (local_18 = 0; local_18 < in_RSI; local_18 = local_18 + 1) {
    pvVar5 = operator_new__(0x8000);
    memset(pvVar5,0,0x8000);
    *(void **)(in_RDI[2] + local_18 * 8) = pvVar5;
    pvVar5 = operator_new__(0x8000);
    memset(pvVar5,0,0x8000);
    *(void **)(in_RDI[3] + local_18 * 8) = pvVar5;
    *(undefined4 *)(in_RDI[1] + local_18 * 4) = 0;
  }
  return;
}

Assistant:

xmrig::Hashrate::Hashrate(size_t threads) :
    m_threads(threads)
{
    m_counts     = new uint64_t*[threads];
    m_timestamps = new uint64_t*[threads];
    m_top        = new uint32_t[threads];

    for (size_t i = 0; i < threads; i++) {
        m_counts[i]     = new uint64_t[kBucketSize]();
        m_timestamps[i] = new uint64_t[kBucketSize]();
        m_top[i]        = 0;
    }
}